

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.c
# Opt level: O2

char * skip_int(char *start,int *out_n)

{
  char cVar1;
  int iVar2;
  char *__nptr;
  ushort **ppuVar3;
  char *pcVar4;
  
  *out_n = 0;
  __nptr = skip_white(start);
  pcVar4 = __nptr;
  if (__nptr == (char *)0x0) {
    pcVar4 = (char *)0x0;
  }
  else {
    while( true ) {
      cVar1 = *pcVar4;
      if (((long)cVar1 == 0) ||
         (ppuVar3 = __ctype_b_loc(), (*(byte *)((long)*ppuVar3 + (long)cVar1 * 2 + 1) & 8) == 0))
      break;
      pcVar4 = pcVar4 + 1;
    }
    *pcVar4 = '\0';
    iVar2 = atoi(__nptr);
    *out_n = iVar2;
    *pcVar4 = cVar1;
  }
  return pcVar4;
}

Assistant:

static char *skip_int(char *start, int *out_n)
{
    char *s;
    char c;

    *out_n = 0;

    s = skip_white(start);
    if (s == NULL) {
        return NULL;
    }
    start = s;

    while (*s) {
        if (!isdigit(*s)) {
            break;
        }
        ++s;
    }
    c = *s;
    *s = 0;
    *out_n = atoi(start);
    *s = c;
    return s;
}